

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::AddDestination(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  long lVar1;
  undefined8 uVar2;
  RTPMemoryManager *pRVar3;
  HashElement *pHVar4;
  byte bVar5;
  ulong uVar6;
  undefined1 auVar7 [12];
  ushort uVar8;
  int iVar10;
  HashElement *pHVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  RTPIPv6Destination dest;
  undefined4 uStack_38;
  uint uStack_34;
  undefined4 uStack_20;
  ushort uVar9;
  
  iVar10 = -0x72;
  if (((this->init == true) && (iVar10 = -0x71, this->created == true)) &&
     (iVar10 = -0x6c, addr->addresstype == IPv6Address)) {
    lVar1 = *(long *)&addr->field_0xc;
    uVar2 = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
    auVar7 = *(undefined1 (*) [12])&addr->field_0xc;
    uVar9 = (ushort)*(undefined4 *)&addr[1].field_0xc;
    uVar8 = uVar9 << 8 | uVar9 >> 8;
    uStack_38 = (undefined4)uVar2;
    uStack_34 = (uint)((ulong)uVar2 >> 0x20);
    uStack_20 = (undefined4)((ulong)lVar1 >> 0x20);
    bVar5 = (byte)((ulong)uVar2 >> 0x38);
    uVar12 = ((uint)bVar5 | (uint)((ulong)uVar2 >> 0x18) & 0xff0000 |
              (uint)((ulong)uVar2 >> 8) & 0xff000000 | uStack_34 >> 8 & 0xff00) % 0x207d;
    for (pHVar11 = (this->destinations).table[uVar12]; pHVar11 != (HashElement *)0x0;
        pHVar11 = pHVar11->hashnext) {
      if (((pHVar11->element).rtpaddr.sin6_port == uVar8) &&
         (auVar13[0] = -((pHVar11->element).rtpaddr.sin6_addr.__in6_u.__u6_addr8[0] == auVar7[0]),
         auVar13[1] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 1) ==
                       auVar7[1]),
         auVar13[2] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 2) ==
                       auVar7[2]),
         auVar13[3] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 3) ==
                       auVar7[3]),
         auVar13[4] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 4) ==
                       auVar7[4]),
         auVar13[5] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 5) ==
                       auVar7[5]),
         auVar13[6] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 6) ==
                       auVar7[6]),
         auVar13[7] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 7) ==
                       auVar7[7]),
         auVar13[8] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 8) ==
                       auVar7[8]),
         auVar13[9] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 9) ==
                       auVar7[9]),
         auVar13[10] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 10)
                        == auVar7[10]),
         auVar13[0xb] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 0xb)
                         == auVar7[0xb]),
         auVar13[0xc] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 0xc)
                         == (char)((ulong)uVar2 >> 0x20)),
         auVar13[0xd] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 0xd)
                         == (char)((ulong)uVar2 >> 0x28)),
         auVar13[0xe] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 0xe)
                         == (char)((ulong)uVar2 >> 0x30)),
         auVar13[0xf] = -(*(undefined1 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 0xf)
                         == bVar5),
         (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                 (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff)) {
        return -4;
      }
    }
    pRVar3 = (this->destinations).super_RTPMemoryObject.mgr;
    if (pRVar3 == (RTPMemoryManager *)0x0) {
      pHVar11 = (HashElement *)operator_new(0x60);
    }
    else {
      pHVar11 = (HashElement *)
                (**(code **)(*(long *)pRVar3 + 0x10))(pRVar3,0x60,(this->destinations).memorytype);
    }
    *(ulong *)((long)&(pHVar11->element).rtcpaddr.sin6_addr.__in6_u + 0xc) = (ulong)uStack_34;
    uVar6 = (ulong)CONCAT22(uVar8,10);
    *(long *)&(pHVar11->element).rtcpaddr.sin6_flowinfo = lVar1 << 0x20;
    *(ulong *)((long)&(pHVar11->element).rtcpaddr.sin6_addr.__in6_u + 4) =
         CONCAT44(uStack_38,uStack_20);
    *(undefined8 *)((long)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u + 8) = uVar2;
    *(ulong *)&(pHVar11->element).rtpaddr.sin6_scope_id =
         CONCAT26((uVar9 + 1) * 0x100 | (ushort)(uVar9 + 1) >> 8,0xa00000000);
    (pHVar11->element).rtpaddr.sin6_family = (short)uVar6;
    (pHVar11->element).rtpaddr.sin6_port = (short)(uVar6 >> 0x10);
    (pHVar11->element).rtpaddr.sin6_flowinfo = (int)(uVar6 >> 0x20);
    *(long *)&(pHVar11->element).rtpaddr.sin6_addr.__in6_u = lVar1;
    pHVar11->hashprev = (HashElement *)0x0;
    pHVar11->hashnext = (HashElement *)0x0;
    pHVar11->listprev = (HashElement *)0x0;
    pHVar11->listnext = (HashElement *)0x0;
    pHVar11->hashindex = uVar12;
    pHVar4 = (this->destinations).table[uVar12];
    (this->destinations).table[uVar12] = pHVar11;
    pHVar11->hashnext = pHVar4;
    if (pHVar4 != (HashElement *)0x0) {
      pHVar4->hashprev = pHVar11;
    }
    if ((this->destinations).firsthashelem == (HashElement *)0x0) {
      (this->destinations).firsthashelem = pHVar11;
    }
    else {
      pHVar4 = (this->destinations).lasthashelem;
      pHVar4->listnext = pHVar11;
      pHVar11->listprev = pHVar4;
    }
    (this->destinations).lasthashelem = pHVar11;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int RTPUDPv6Transmitter::AddDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	RTPIPv6Address &address = (RTPIPv6Address &)addr;
	RTPIPv6Destination dest(address.GetIP(),address.GetPort());
	int status = destinations.AddElement(dest);

	MAINMUTEX_UNLOCK
	return status;
}